

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wcssub.c
# Opt level: O0

int ffgicsa(fitsfile *fptr,char version,double *xrval,double *yrval,double *xrpix,double *yrpix,
           double *xinc,double *yinc,double *rot,char *type,int *status)

{
  undefined8 uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  undefined8 *in_RCX;
  undefined8 *in_RDX;
  char in_SIL;
  undefined8 *in_R8;
  undefined8 *in_R9;
  fitsfile *pfVar6;
  double __x;
  double dVar7;
  double *in_stack_00000008;
  double *in_stack_00000010;
  double *in_stack_00000018;
  char *in_stack_00000020;
  int *in_stack_00000028;
  double toler;
  double temp;
  double phib;
  double phia;
  double pi;
  double pc12;
  double pc22;
  double pc21;
  double pc11;
  double cd12;
  double cd22;
  double cd21;
  double cd11;
  char alt [2];
  char keyname [71];
  char ctype [71];
  int pc_exists;
  int cd_exists;
  int tstat;
  fitsfile *local_188;
  fitsfile *local_180;
  fitsfile *in_stack_fffffffffffffe98;
  fitsfile *in_stack_fffffffffffffea0;
  double *value;
  fitsfile *in_stack_fffffffffffffeb0;
  fitsfile *in_stack_fffffffffffffeb8;
  fitsfile *local_140;
  char local_ea [58];
  double *in_stack_ffffffffffffff50;
  double *in_stack_ffffffffffffff58;
  double *in_stack_ffffffffffffff60;
  double *in_stack_ffffffffffffff68;
  double *in_stack_ffffffffffffff70;
  fitsfile *in_stack_ffffffffffffff78;
  double *in_stack_ffffffffffffff90;
  double *in_stack_ffffffffffffff98;
  char *in_stack_ffffffffffffffa0;
  int *in_stack_ffffffffffffffa8;
  int local_c;
  
  value = (double *)0x3f2a36e2eb1c432d;
  if (*in_stack_00000028 < 1) {
    if (in_SIL == ' ') {
      ffgics(in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
             in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
             in_stack_ffffffffffffff90,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffffa8);
      local_c = *in_stack_00000028;
    }
    else if ((in_SIL < '[') && ('@' < in_SIL)) {
      local_ea[1] = 0;
      strcpy(local_ea + 2,"CRVAL1");
      strcat(local_ea + 2,local_ea);
      iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                     (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
      if (iVar2 != 0) {
        *in_RDX = 0;
      }
      strcpy(local_ea + 2,"CRVAL2");
      strcat(local_ea + 2,local_ea);
      iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                     (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
      if (iVar2 != 0) {
        *in_RCX = 0;
      }
      strcpy(local_ea + 2,"CRPIX1");
      strcat(local_ea + 2,local_ea);
      iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                     (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
      if (iVar2 != 0) {
        *in_R8 = 0;
      }
      strcpy(local_ea + 2,"CRPIX2");
      strcat(local_ea + 2,local_ea);
      iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                     (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
      if (iVar2 != 0) {
        *in_R9 = 0;
      }
      strcpy(local_ea + 2,"CDELT1");
      strcat(local_ea + 2,local_ea);
      iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                     (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
      if (iVar2 == 0) {
        strcpy(local_ea + 2,"CDELT2");
        strcat(local_ea + 2,local_ea);
        iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                       (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
        if (iVar2 != 0) {
          *in_stack_00000010 = 1.0;
        }
        strcpy(local_ea + 2,"CROTA2");
        strcat(local_ea + 2,local_ea);
        iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                       (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
        if (iVar2 != 0) {
          *in_stack_00000018 = 0.0;
          strcpy(local_ea + 2,"PC1_1");
          strcat(local_ea + 2,local_ea);
          iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                         (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
          strcpy(local_ea + 2,"PC2_1");
          strcat(local_ea + 2,local_ea);
          iVar3 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                         (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
          strcpy(local_ea + 2,"PC1_2");
          strcat(local_ea + 2,local_ea);
          iVar4 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                         (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
          strcpy(local_ea + 2,"PC2_2");
          strcat(local_ea + 2,local_ea);
          iVar5 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                         (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
          if (iVar5 == 0 || (iVar4 == 0 || (iVar3 == 0 || iVar2 == 0))) {
            pfVar6 = (fitsfile *)atan2(0.0,1.0);
            local_188 = (fitsfile *)atan2(-0.0,1.0);
            local_180 = local_188;
            if ((double)pfVar6 < (double)local_188) {
              local_180 = pfVar6;
            }
            if ((double)local_188 < (double)pfVar6) {
              local_188 = pfVar6;
            }
            local_140 = local_180;
            if (1.5707963267948966 < (double)local_188 - (double)local_180) {
              local_140 = (fitsfile *)((double)local_180 + 3.141592653589793);
            }
            if ((double)value < ABS((double)local_140 - (double)local_188)) {
              *in_stack_00000028 = 0x1fa;
            }
            *in_stack_00000018 =
                 ((((double)local_140 + (double)local_188) / 2.0) * 180.0) / 3.141592653589793;
            in_stack_fffffffffffffeb0 = local_180;
            in_stack_fffffffffffffeb8 = local_188;
          }
        }
      }
      else {
        strcpy(local_ea + 2,"CD1_1");
        strcat(local_ea + 2,local_ea);
        iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                       (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
        strcpy(local_ea + 2,"CD2_1");
        strcat(local_ea + 2,local_ea);
        iVar3 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                       (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
        strcpy(local_ea + 2,"CD1_2");
        strcat(local_ea + 2,local_ea);
        iVar4 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                       (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
        strcpy(local_ea + 2,"CD2_2");
        strcat(local_ea + 2,local_ea);
        iVar5 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                       (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
        if (iVar5 == 0 || (iVar4 == 0 || (iVar3 == 0 || iVar2 == 0))) {
          pfVar6 = (fitsfile *)atan2(0.0,0.0);
          in_stack_fffffffffffffe98 = (fitsfile *)atan2(-0.0,0.0);
          in_stack_fffffffffffffea0 = in_stack_fffffffffffffe98;
          if ((double)pfVar6 < (double)in_stack_fffffffffffffe98) {
            in_stack_fffffffffffffea0 = pfVar6;
          }
          if ((double)in_stack_fffffffffffffe98 < (double)pfVar6) {
            in_stack_fffffffffffffe98 = pfVar6;
          }
          local_140 = in_stack_fffffffffffffea0;
          if (1.5707963267948966 <
              (double)in_stack_fffffffffffffe98 - (double)in_stack_fffffffffffffea0) {
            local_140 = (fitsfile *)((double)in_stack_fffffffffffffea0 + 3.141592653589793);
          }
          if ((double)value < ABS((double)local_140 - (double)in_stack_fffffffffffffe98)) {
            *in_stack_00000028 = 0x1fa;
          }
          __x = ((double)local_140 + (double)in_stack_fffffffffffffe98) / 2.0;
          in_stack_fffffffffffffeb0 = in_stack_fffffffffffffea0;
          in_stack_fffffffffffffeb8 = in_stack_fffffffffffffe98;
          dVar7 = cos(__x);
          *in_stack_00000008 = 0.0 / dVar7;
          dVar7 = cos(__x);
          *in_stack_00000010 = 0.0 / dVar7;
          *in_stack_00000018 = (__x * 180.0) / 3.141592653589793;
          if (*in_stack_00000010 <= 0.0 && *in_stack_00000010 != 0.0) {
            *in_stack_00000008 = -*in_stack_00000008;
            *in_stack_00000010 = -*in_stack_00000010;
            *in_stack_00000018 = *in_stack_00000018 - 180.0;
          }
        }
        else {
          *in_stack_00000008 = 1.0;
          strcpy(local_ea + 2,"CDELT2");
          strcat(local_ea + 2,local_ea);
          iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                         (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
          if (iVar2 != 0) {
            *in_stack_00000010 = 1.0;
          }
          strcpy(local_ea + 2,"CROTA2");
          strcat(local_ea + 2,local_ea);
          iVar2 = ffgkyd(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,value,
                         (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
          if (iVar2 != 0) {
            *in_stack_00000018 = 0.0;
          }
        }
      }
      strcpy(local_ea + 2,"CTYPE1");
      strcat(local_ea + 2,local_ea);
      iVar2 = ffgkys(in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,(char *)value,
                     (char *)in_stack_fffffffffffffea0,&in_stack_fffffffffffffe98->HDUposition);
      if (iVar2 == 0) {
        strncpy(in_stack_00000020,&stack0xffffffffffffff6c,4);
        in_stack_00000020[4] = '\0';
        iVar2 = strncmp(&stack0xffffffffffffff68,"DEC-",4);
        if ((iVar2 == 0) || (iVar2 = strncmp(&stack0xffffffffffffff69,"LAT",3), iVar2 == 0)) {
          *in_stack_00000018 = 90.0 - *in_stack_00000018;
          *in_stack_00000010 = -*in_stack_00000010;
          uVar1 = *in_RDX;
          *in_RDX = *in_RCX;
          *in_RCX = uVar1;
        }
      }
      else {
        *in_stack_00000020 = '\0';
      }
      local_c = *in_stack_00000028;
    }
    else {
      ffpmsg((char *)0x25160a);
      *in_stack_00000028 = 0x1f7;
      local_c = 0x1f7;
    }
  }
  else {
    local_c = *in_stack_00000028;
  }
  return local_c;
}

Assistant:

int ffgicsa(fitsfile *fptr,    /* I - FITS file pointer           */
           char version,      /* I - character code of desired version */
	                      /*     A - Z or blank */
           double *xrval,     /* O - X reference value           */
           double *yrval,     /* O - Y reference value           */
           double *xrpix,     /* O - X reference pixel           */
           double *yrpix,     /* O - Y reference pixel           */
           double *xinc,      /* O - X increment per pixel       */
           double *yinc,      /* O - Y increment per pixel       */
           double *rot,       /* O - rotation angle (degrees)    */
           char *type,        /* O - type of projection ('-tan') */
           int *status)       /* IO - error status               */
/*
       read the values of the celestial coordinate system keywords.
       These values may be used as input to the subroutines that
       calculate celestial coordinates. (ffxypx, ffwldp)

       Modified in Nov 1999 to convert the CD matrix keywords back
       to the old CDELTn form, and to swap the axes if the dec-like
       axis is given first, and to assume default values if any of the
       keywords are not present.
*/
{
    int tstat = 0, cd_exists = 0, pc_exists = 0;
    char ctype[FLEN_VALUE], keyname[FLEN_VALUE], alt[2];
    double cd11 = 0.0, cd21 = 0.0, cd22 = 0.0, cd12 = 0.0;
    double pc11 = 1.0, pc21 = 0.0, pc22 = 1.0, pc12 = 0.0;
    double pi =  3.1415926535897932;
    double phia, phib, temp;
    double toler = .0002;  /* tolerance for angles to agree (radians) */
                           /*   (= approximately 0.01 degrees) */

    if (*status > 0)
       return(*status);

    if (version == ' ') {
      ffgics(fptr, xrval, yrval, xrpix, yrpix, xinc, yinc, rot, type, status);
      return (*status);
    }

    if (version > 'Z' || version < 'A') {
      ffpmsg("ffgicsa: illegal WCS version code (must be A - Z or blank)");
      return(*status = WCS_ERROR);
    }

    alt[0] = version;
    alt[1] = '\0';
    
    tstat = 0;
    strcpy(keyname, "CRVAL1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xrval, NULL, &tstat))
       *xrval = 0.;

    tstat = 0;
    strcpy(keyname, "CRVAL2");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, yrval, NULL, &tstat))
       *yrval = 0.;

    tstat = 0;
    strcpy(keyname, "CRPIX1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xrpix, NULL, &tstat))
        *xrpix = 0.;

    tstat = 0;
    strcpy(keyname, "CRPIX2");
    strcat(keyname, alt);
     if (ffgkyd(fptr, keyname, yrpix, NULL, &tstat))
        *yrpix = 0.;

    /* look for CDELTn first, then CDi_j keywords */
    tstat = 0;
    strcpy(keyname, "CDELT1");
    strcat(keyname, alt);
    if (ffgkyd(fptr, keyname, xinc, NULL, &tstat))
    {
        /* CASE 1: no CDELTn keyword, so look for the CD matrix */
        tstat = 0;
        strcpy(keyname, "CD1_1");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd11, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD2_1");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd21, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD1_2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd12, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        strcpy(keyname, "CD2_2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, &cd22, NULL, &tstat))
            tstat = 0;  /* reset keyword not found error */
        else
            cd_exists = 1;  /* found at least 1 CD_ keyword */

        if (cd_exists)  /* convert CDi_j back to CDELTn */
        {
            /* there are 2 ways to compute the angle: */
            phia = atan2( cd21, cd11);
            phib = atan2(-cd12, cd22);

            /* ensure that phia <= phib */
            temp = minvalue(phia, phib);
            phib = maxvalue(phia, phib);
            phia = temp;

            /* there is a possible 180 degree ambiguity in the angles */
            /* so add 180 degress to the smaller value if the values  */
            /* differ by more than 90 degrees = pi/2 radians.         */
            /* (Later, we may decide to take the other solution by    */
            /* subtracting 180 degrees from the larger value).        */

            if ((phib - phia) > (pi / 2.))
               phia += pi;

            if (fabs(phia - phib) > toler) 
            {
               /* angles don't agree, so looks like there is some skewness */
               /* between the axes.  Return with an error to be safe. */
               *status = APPROX_WCS_KEY;
            }
      
            phia = (phia + phib) /2.;  /* use the average of the 2 values */
            *xinc = cd11 / cos(phia);
            *yinc = cd22 / cos(phia);
            *rot = phia * 180. / pi;

            /* common usage is to have a positive yinc value.  If it is */
            /* negative, then subtract 180 degrees from rot and negate  */
            /* both xinc and yinc.  */

            if (*yinc < 0)
            {
                *xinc = -(*xinc);
                *yinc = -(*yinc);
                *rot = *rot - 180.;
            }
        }
        else   /* no CD matrix keywords either */
        {
            *xinc = 1.;

            /* there was no CDELT1 keyword, but check for CDELT2 just in case */
            tstat = 0;
            strcpy(keyname, "CDELT2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, yinc, NULL, &tstat))
                *yinc = 1.;

            tstat = 0;
            strcpy(keyname, "CROTA2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, rot, NULL, &tstat))
                *rot=0.;
        }
    }
    else  /* Case 2: CDELTn + optional PC matrix */
    {
        strcpy(keyname, "CDELT2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, yinc, NULL, &tstat))
            *yinc = 1.;

        tstat = 0;
        strcpy(keyname, "CROTA2");
        strcat(keyname, alt);
        if (ffgkyd(fptr, keyname, rot, NULL, &tstat))
        {
            *rot=0.;

            /* no CROTA2 keyword, so look for the PC matrix */
            tstat = 0;
            strcpy(keyname, "PC1_1");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc11, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC2_1");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc21, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC1_2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc12, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            strcpy(keyname, "PC2_2");
            strcat(keyname, alt);
            if (ffgkyd(fptr, keyname, &pc22, NULL, &tstat))
                tstat = 0;  /* reset keyword not found error */
            else
                pc_exists = 1;  /* found at least 1 PC_ keyword */

            if (pc_exists)  /* convert PCi_j back to CDELTn */
            {
                /* there are 2 ways to compute the angle: */
                phia = atan2( pc21, pc11);
                phib = atan2(-pc12, pc22);

                /* ensure that phia <= phib */
                temp = minvalue(phia, phib);
                phib = maxvalue(phia, phib);
                phia = temp;

                /* there is a possible 180 degree ambiguity in the angles */
                /* so add 180 degress to the smaller value if the values  */
                /* differ by more than 90 degrees = pi/2 radians.         */
                /* (Later, we may decide to take the other solution by    */
                /* subtracting 180 degrees from the larger value).        */

                if ((phib - phia) > (pi / 2.))
                   phia += pi;

                if (fabs(phia - phib) > toler) 
                {
                  /* angles don't agree, so looks like there is some skewness */
                  /* between the axes.  Return with an error to be safe. */
                  *status = APPROX_WCS_KEY;
                }
      
                phia = (phia + phib) /2.;  /* use the average of the 2 values */
                *rot = phia * 180. / pi;
            }
        }
    }

    /* get the type of projection, if any */
    tstat = 0;
    strcpy(keyname, "CTYPE1");
    strcat(keyname, alt);
    if (ffgkys(fptr, keyname, ctype, NULL, &tstat))
         type[0] = '\0';
    else
    {
        /* copy the projection type string */
        strncpy(type, &ctype[4], 4);
        type[4] = '\0';

        /* check if RA and DEC are inverted */
        if (!strncmp(ctype, "DEC-", 4) || !strncmp(ctype+1, "LAT", 3))
        {
            /* the latitudinal axis is given first, so swap them */

            *rot = 90. - (*rot);

            /* Empirical tests with ds9 show the y-axis sign must be negated */
            /* and the xinc and yinc values must NOT be swapped. */
            *yinc = -(*yinc);

            temp = *xrval;
            *xrval = *yrval;
            *yrval = temp;
        }   
    }

    return(*status);
}